

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unames.cpp
# Opt level: O1

UBool icu_63::enumGroupNames
                (UCharNames *names,uint16_t *group,UChar32 start,UChar32 end,UEnumCharNamesFn *fn,
                void *context,UCharNameChoice nameChoice)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  byte *pbVar4;
  UBool UVar5;
  uint16_t uVar6;
  uint8_t *puVar7;
  ulong uVar8;
  ushort uVar9;
  byte *pbVar10;
  byte *pbVar11;
  short sVar12;
  short sVar13;
  byte *pbVar14;
  byte *pbVar15;
  UCharNameChoice UVar16;
  bool bVar17;
  uint8_t *tokenStrings;
  uint16_t lengths [34];
  uint16_t offsets [34];
  char buffer [200];
  uint16_t local_198 [40];
  uint16_t local_148 [40];
  char local_f8 [200];
  
  puVar7 = expandGroupLengths((uint8_t *)
                              ((long)&names->tokenStringOffset +
                              ((long)(int)((uint)group[1] << 0x10) | (ulong)group[2]) +
                              (ulong)names->groupStringOffset),local_148,local_198);
  if (fn == (UEnumCharNamesFn *)0x0) {
    if (start <= end) {
      pbVar4 = *context;
      uVar3 = (ushort)names[1].tokenStringOffset;
      do {
        uVar8 = (ulong)((start & 0x1fU) * 2);
        pbVar11 = puVar7 + *(ushort *)((long)local_148 + uVar8);
        sVar12 = *(short *)((long)local_198 + uVar8);
        if ((nameChoice & ~U_EXTENDED_CHAR_NAME) != U_UNICODE_CHAR_NAME) {
          UVar16 = nameChoice;
          if ((uVar3 < 0x3c) || ((short)names[8].groupStringOffset == -1)) {
            do {
              sVar13 = sVar12;
              if (sVar12 != 0) {
                do {
                  sVar12 = sVar13 + -1;
                  bVar1 = *pbVar11;
                  pbVar11 = pbVar11 + 1;
                  if (bVar1 == 0x3b) break;
                  bVar17 = sVar13 != 1;
                  sVar13 = sVar12;
                } while (bVar17);
              }
              bVar17 = 1 < (int)UVar16;
              UVar16 = UVar16 - U_UNICODE_10_CHAR_NAME;
            } while (bVar17);
          }
          else {
            sVar12 = 0;
          }
        }
        pbVar14 = pbVar4;
        if (sVar12 != 0) {
LAB_002e6ea8:
          bVar1 = *pbVar11;
          pbVar15 = pbVar11;
          sVar13 = sVar12;
          while( true ) {
            sVar12 = sVar13 + -1;
            pbVar11 = pbVar15 + 1;
            if (uVar3 <= bVar1) break;
            uVar9 = *(ushort *)((long)&names[1].tokenStringOffset + (ulong)bVar1 * 2 + 2);
            if (uVar9 == 0xfffe) {
              uVar9 = *(ushort *)
                       ((long)&names[1].tokenStringOffset +
                       (ulong)((uint)bVar1 * 0x200 + (uint)*pbVar11 * 2) + 2);
              sVar12 = sVar13 + -2;
              pbVar11 = pbVar15 + 2;
            }
            if (uVar9 != 0xffff) {
              pbVar10 = (byte *)((long)&names->tokenStringOffset +
                                (ulong)uVar9 + (ulong)names->tokenStringOffset);
              pbVar15 = pbVar14;
              goto LAB_002e6f67;
            }
            if (bVar1 != 0x3b) {
              if (bVar1 != *pbVar14) goto LAB_002e6f9d;
              pbVar14 = pbVar14 + 1;
              goto LAB_002e6f53;
            }
            if ((nameChoice != U_EXTENDED_CHAR_NAME || pbVar14 != pbVar4) ||
               (((0x3b < uVar3 && ((short)names[8].groupStringOffset != -1)) || (sVar12 == 0))))
            goto LAB_002e6f97;
            bVar1 = *pbVar11;
            pbVar15 = pbVar11;
            sVar13 = sVar12;
          }
          if (bVar1 != 0x3b) {
            if (bVar1 == *pbVar14) {
              pbVar14 = pbVar14 + 1;
              goto LAB_002e6f53;
            }
            goto LAB_002e6f9d;
          }
        }
LAB_002e6f97:
        if (*pbVar14 == 0) {
          *(UChar32 *)((long)context + 8) = start;
          return '\0';
        }
LAB_002e6f9d:
        bVar17 = start != end;
        start = start + 1;
      } while (bVar17);
    }
  }
  else if (start <= end) {
    do {
      uVar8 = (ulong)((start & 0x1fU) * 2);
      uVar6 = expandName(names,puVar7 + *(ushort *)((long)local_148 + uVar8),
                         *(uint16_t *)((long)local_198 + uVar8),nameChoice,local_f8,200);
      if ((nameChoice == U_EXTENDED_CHAR_NAME) && (uVar6 == 0)) {
        uVar6 = getExtName(start,local_f8,200);
        local_f8[uVar6] = '\0';
      }
      if ((uVar6 != 0) &&
         (UVar5 = (*fn)(context,start,nameChoice,local_f8,(int32_t)uVar6), UVar5 == '\0')) {
        return '\0';
      }
      start = start + 1;
    } while (end + 1U != start);
  }
  return '\x01';
  while( true ) {
    pbVar10 = pbVar10 + 1;
    pbVar14 = pbVar15 + 1;
    bVar2 = *pbVar15;
    pbVar15 = pbVar14;
    if (bVar1 != bVar2) break;
LAB_002e6f67:
    bVar1 = *pbVar10;
    pbVar14 = pbVar15;
    if (bVar1 == 0) break;
  }
  if (bVar1 != 0) goto LAB_002e6f9d;
LAB_002e6f53:
  if (sVar12 == 0) goto LAB_002e6f97;
  goto LAB_002e6ea8;
}

Assistant:

static UBool
enumGroupNames(UCharNames *names, const uint16_t *group,
               UChar32 start, UChar32 end,
               UEnumCharNamesFn *fn, void *context,
               UCharNameChoice nameChoice) {
    uint16_t offsets[LINES_PER_GROUP+2], lengths[LINES_PER_GROUP+2];
    const uint8_t *s=(uint8_t *)names+names->groupStringOffset+GET_GROUP_OFFSET(group);

    s=expandGroupLengths(s, offsets, lengths);
    if(fn!=DO_FIND_NAME) {
        char buffer[200];
        uint16_t length;

        while(start<=end) {
            length=expandName(names, s+offsets[start&GROUP_MASK], lengths[start&GROUP_MASK], nameChoice, buffer, sizeof(buffer));
            if (!length && nameChoice == U_EXTENDED_CHAR_NAME) {
                buffer[length = getExtName(start, buffer, sizeof(buffer))] = 0;
            }
            /* here, we assume that the buffer is large enough */
            if(length>0) {
                if(!fn(context, start, nameChoice, buffer, length)) {
                    return FALSE;
                }
            }
            ++start;
        }
    } else {
        const char *otherName=((FindName *)context)->otherName;
        while(start<=end) {
            if(compareName(names, s+offsets[start&GROUP_MASK], lengths[start&GROUP_MASK], nameChoice, otherName)) {
                ((FindName *)context)->code=start;
                return FALSE;
            }
            ++start;
        }
    }
    return TRUE;
}